

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_NeuralNetwork_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007466f8 == '\x01') {
    DAT_007466f8 = '\0';
    (*(code *)*_NeuralNetwork_default_instance_)();
  }
  if (DAT_00746728 == '\x01') {
    DAT_00746728 = '\0';
    (*(code *)*_NeuralNetworkImageScaler_default_instance_)();
  }
  if (DAT_00746758 == '\x01') {
    DAT_00746758 = '\0';
    (*(code *)*_NeuralNetworkMeanImage_default_instance_)();
  }
  if (DAT_00746788 == '\x01') {
    DAT_00746788 = '\0';
    (*(code *)*_NeuralNetworkPreprocessing_default_instance_)();
  }
  if (DAT_007467b8 == '\x01') {
    DAT_007467b8 = '\0';
    (*(code *)*_ActivationReLU_default_instance_)();
  }
  if (DAT_007467d8 == '\x01') {
    DAT_007467d8 = '\0';
    (*(code *)*_ActivationLeakyReLU_default_instance_)();
  }
  if (DAT_007467f8 == '\x01') {
    DAT_007467f8 = '\0';
    (*(code *)*_ActivationTanh_default_instance_)();
  }
  if (DAT_00746820 == '\x01') {
    DAT_00746820 = '\0';
    (*(code *)*_ActivationScaledTanh_default_instance_)();
  }
  if (DAT_00746840 == '\x01') {
    DAT_00746840 = '\0';
    (*(code *)*_ActivationSigmoid_default_instance_)();
  }
  if (DAT_00746868 == '\x01') {
    DAT_00746868 = '\0';
    (*(code *)*_ActivationLinear_default_instance_)();
  }
  if (DAT_00746890 == '\x01') {
    DAT_00746890 = '\0';
    (*(code *)*_ActivationSigmoidHard_default_instance_)();
  }
  if (DAT_007468b8 == '\x01') {
    DAT_007468b8 = '\0';
    (*(code *)*_ActivationPReLU_default_instance_)();
  }
  if (DAT_007468d8 == '\x01') {
    DAT_007468d8 = '\0';
    (*(code *)*_ActivationELU_default_instance_)();
  }
  if (DAT_007468f8 == '\x01') {
    DAT_007468f8 = '\0';
    (*(code *)*_ActivationThresholdedReLU_default_instance_)();
  }
  if (DAT_00746918 == '\x01') {
    DAT_00746918 = '\0';
    (*(code *)*_ActivationSoftsign_default_instance_)();
  }
  if (DAT_00746938 == '\x01') {
    DAT_00746938 = '\0';
    (*(code *)*_ActivationSoftplus_default_instance_)();
  }
  if (DAT_00746968 == '\x01') {
    DAT_00746968 = '\0';
    (*(code *)*_ActivationParametricSoftplus_default_instance_)();
  }
  if (DAT_00746990 == '\x01') {
    DAT_00746990 = '\0';
    (*(code *)*_ActivationParams_default_instance_)();
  }
  if (DAT_00746a30 == '\x01') {
    DAT_00746a30 = '\0';
    (*(code *)*_Tensor_default_instance_)();
  }
  if (DAT_00746ac8 == '\x01') {
    DAT_00746ac8 = '\0';
    (*(code *)*_NeuralNetworkLayer_default_instance_)();
  }
  if (DAT_00746fe8 == '\x01') {
    DAT_00746fe8 = '\0';
    (*(code *)*_BranchLayerParams_default_instance_)();
  }
  if (DAT_00747028 == '\x01') {
    DAT_00747028 = '\0';
    (*(code *)*_LoopLayerParams_default_instance_)();
  }
  if (DAT_00747048 == '\x01') {
    DAT_00747048 = '\0';
    (*(code *)*_LoopBreakLayerParams_default_instance_)();
  }
  if (DAT_00747068 == '\x01') {
    DAT_00747068 = '\0';
    (*(code *)*_LoopContinueLayerParams_default_instance_)();
  }
  if (DAT_00747088 == '\x01') {
    DAT_00747088 = '\0';
    (*(code *)*_CopyLayerParams_default_instance_)();
  }
  if (DAT_007470a8 == '\x01') {
    DAT_007470a8 = '\0';
    (*(code *)*_GreaterThanLayerParams_default_instance_)();
  }
  if (DAT_007470c8 == '\x01') {
    DAT_007470c8 = '\0';
    (*(code *)*_GreaterEqualLayerParams_default_instance_)();
  }
  if (DAT_007470e8 == '\x01') {
    DAT_007470e8 = '\0';
    (*(code *)*_LessThanLayerParams_default_instance_)();
  }
  if (DAT_00747108 == '\x01') {
    DAT_00747108 = '\0';
    (*(code *)*_LessEqualLayerParams_default_instance_)();
  }
  if (DAT_00747128 == '\x01') {
    DAT_00747128 = '\0';
    (*(code *)*_EqualLayerParams_default_instance_)();
  }
  if (DAT_00747148 == '\x01') {
    DAT_00747148 = '\0';
    (*(code *)*_NotEqualLayerParams_default_instance_)();
  }
  if (DAT_00747168 == '\x01') {
    DAT_00747168 = '\0';
    (*(code *)*_LogicalAndLayerParams_default_instance_)();
  }
  if (DAT_00747188 == '\x01') {
    DAT_00747188 = '\0';
    (*(code *)*_LogicalOrLayerParams_default_instance_)();
  }
  if (DAT_007471a8 == '\x01') {
    DAT_007471a8 = '\0';
    (*(code *)*_LogicalXorLayerParams_default_instance_)();
  }
  if (DAT_007471c8 == '\x01') {
    DAT_007471c8 = '\0';
    (*(code *)*_LogicalNotLayerParams_default_instance_)();
  }
  if (DAT_007471f8 == '\x01') {
    DAT_007471f8 = '\0';
    (*(code *)*_BorderAmounts_EdgeSizes_default_instance_)();
  }
  if (DAT_00747230 == '\x01') {
    DAT_00747230 = '\0';
    (*(code *)*_BorderAmounts_default_instance_)();
  }
  if (DAT_00747258 == '\x01') {
    DAT_00747258 = '\0';
    (*(code *)*_ValidPadding_default_instance_)();
  }
  if (DAT_00747278 == '\x01') {
    DAT_00747278 = '\0';
    (*(code *)*_SamePadding_default_instance_)();
  }
  if (DAT_00747298 == '\x01') {
    DAT_00747298 = '\0';
    (*(code *)*_SamplingMode_default_instance_)();
  }
  if (DAT_007472b8 == '\x01') {
    DAT_007472b8 = '\0';
    (*(code *)*_BoxCoordinatesMode_default_instance_)();
  }
  if (DAT_00747310 == '\x01') {
    DAT_00747310 = '\0';
    (*(code *)*_WeightParams_default_instance_)();
  }
  if (DAT_00747340 == '\x01') {
    DAT_00747340 = '\0';
    (*(code *)*_QuantizationParams_default_instance_)();
  }
  if (DAT_00747398 == '\x01') {
    DAT_00747398 = '\0';
    (*(code *)*_LinearQuantizationParams_default_instance_)();
  }
  if (DAT_007473c8 == '\x01') {
    DAT_007473c8 = '\0';
    (*(code *)*_LookUpTableQuantizationParams_default_instance_)();
  }
  if (DAT_00747480 == '\x01') {
    DAT_00747480 = '\0';
    (*(code *)*_ConvolutionLayerParams_default_instance_)();
  }
  if (DAT_00747528 == '\x01') {
    DAT_00747528 = '\0';
    (*(code *)*_Convolution3DLayerParams_default_instance_)();
  }
  if (DAT_00747568 == '\x01') {
    DAT_00747568 = '\0';
    (*(code *)*_InnerProductLayerParams_default_instance_)();
  }
  if (DAT_007475a8 == '\x01') {
    DAT_007475a8 = '\0';
    (*(code *)*_EmbeddingLayerParams_default_instance_)();
  }
  if (DAT_007475e8 == '\x01') {
    DAT_007475e8 = '\0';
    (*(code *)*_EmbeddingNDLayerParams_default_instance_)();
  }
  if (DAT_00747638 == '\x01') {
    DAT_00747638 = '\0';
    (*(code *)*_BatchnormLayerParams_default_instance_)();
  }
  if (DAT_00747668 == '\x01') {
    DAT_00747668 = '\0';
    (*(code *)*_PoolingLayerParams_ValidCompletePadding_default_instance_)();
  }
  if (DAT_007476c8 == '\x01') {
    DAT_007476c8 = '\0';
    (*(code *)*_PoolingLayerParams_default_instance_)();
  }
  if (DAT_00747738 == '\x01') {
    DAT_00747738 = '\0';
    (*(code *)*_Pooling3DLayerParams_default_instance_)();
  }
  if (DAT_00747758 == '\x01') {
    DAT_00747758 = '\0';
    (*(code *)*_GlobalPooling3DLayerParams_default_instance_)();
  }
  if (DAT_00747778 == '\x01') {
    DAT_00747778 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingConstant_default_instance_)();
  }
  if (DAT_00747798 == '\x01') {
    DAT_00747798 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingReflection_default_instance_)();
  }
  if (DAT_007477b8 == '\x01') {
    DAT_007477b8 = '\0';
    (*(code *)*_PaddingLayerParams_PaddingReplication_default_instance_)();
  }
  if (DAT_007477e8 == '\x01') {
    DAT_007477e8 = '\0';
    (*(code *)*_PaddingLayerParams_default_instance_)();
  }
  if (DAT_00747820 == '\x01') {
    DAT_00747820 = '\0';
    (*(code *)*_ConcatLayerParams_default_instance_)();
  }
  if (DAT_00747850 == '\x01') {
    DAT_00747850 = '\0';
    (*(code *)*_LRNLayerParams_default_instance_)();
  }
  if (DAT_00747870 == '\x01') {
    DAT_00747870 = '\0';
    (*(code *)*_SoftmaxLayerParams_default_instance_)();
  }
  if (DAT_00747898 == '\x01') {
    DAT_00747898 = '\0';
    (*(code *)*_SplitLayerParams_default_instance_)();
  }
  if (DAT_007478b8 == '\x01') {
    DAT_007478b8 = '\0';
    (*(code *)*_AddLayerParams_default_instance_)();
  }
  if (DAT_007478d8 == '\x01') {
    DAT_007478d8 = '\0';
    (*(code *)*_MultiplyLayerParams_default_instance_)();
  }
  if (DAT_00747908 == '\x01') {
    DAT_00747908 = '\0';
    (*(code *)*_UnaryFunctionLayerParams_default_instance_)();
  }
  if (DAT_00747958 == '\x01') {
    DAT_00747958 = '\0';
    (*(code *)*_UpsampleLayerParams_default_instance_)();
  }
  if (DAT_00747998 == '\x01') {
    DAT_00747998 = '\0';
    (*(code *)*_ResizeBilinearLayerParams_default_instance_)();
  }
  if (DAT_007479e8 == '\x01') {
    DAT_007479e8 = '\0';
    (*(code *)*_CropResizeLayerParams_default_instance_)();
  }
  if (DAT_00747a28 == '\x01') {
    DAT_00747a28 = '\0';
    (*(code *)*_BiasLayerParams_default_instance_)();
  }
  if (DAT_00747a88 == '\x01') {
    DAT_00747a88 = '\0';
    (*(code *)*_ScaleLayerParams_default_instance_)();
  }
  if (DAT_00747ac8 == '\x01') {
    DAT_00747ac8 = '\0';
    (*(code *)*_LoadConstantLayerParams_default_instance_)();
  }
  if (DAT_00747ae8 == '\x01') {
    DAT_00747ae8 = '\0';
    (*(code *)*_L2NormalizeLayerParams_default_instance_)();
  }
  if (DAT_00747b08 == '\x01') {
    DAT_00747b08 = '\0';
    (*(code *)*_FlattenLayerParams_default_instance_)();
  }
  if (DAT_00747b40 == '\x01') {
    DAT_00747b40 = '\0';
    (*(code *)*_ReshapeLayerParams_default_instance_)();
  }
  if (DAT_00747b70 == '\x01') {
    DAT_00747b70 = '\0';
    (*(code *)*_PermuteLayerParams_default_instance_)();
  }
  if (DAT_00747b98 == '\x01') {
    DAT_00747b98 = '\0';
    (*(code *)*_ReorganizeDataLayerParams_default_instance_)();
  }
  if (DAT_00747bd0 == '\x01') {
    DAT_00747bd0 = '\0';
    (*(code *)*_SliceLayerParams_default_instance_)();
  }
  if (DAT_00747bf8 == '\x01') {
    DAT_00747bf8 = '\0';
    (*(code *)*_ReduceLayerParams_default_instance_)();
  }
  if (DAT_00747c38 == '\x01') {
    DAT_00747c38 = '\0';
    (*(code *)*_CropLayerParams_default_instance_)();
  }
  if (DAT_00747c58 == '\x01') {
    DAT_00747c58 = '\0';
    (*(code *)*_AverageLayerParams_default_instance_)();
  }
  if (DAT_00747c78 == '\x01') {
    DAT_00747c78 = '\0';
    (*(code *)*_MaxLayerParams_default_instance_)();
  }
  if (DAT_00747c98 == '\x01') {
    DAT_00747c98 = '\0';
    (*(code *)*_MinLayerParams_default_instance_)();
  }
  if (DAT_00747cb8 == '\x01') {
    DAT_00747cb8 = '\0';
    (*(code *)*_DotProductLayerParams_default_instance_)();
  }
  if (DAT_00747ce0 == '\x01') {
    DAT_00747ce0 = '\0';
    (*(code *)*_MeanVarianceNormalizeLayerParams_default_instance_)();
  }
  if (DAT_00747d08 == '\x01') {
    DAT_00747d08 = '\0';
    (*(code *)*_SequenceRepeatLayerParams_default_instance_)();
  }
  if (DAT_00747d58 == '\x01') {
    DAT_00747d58 = '\0';
    (*(code *)*_SimpleRecurrentLayerParams_default_instance_)();
  }
  if (DAT_00747de8 == '\x01') {
    DAT_00747de8 = '\0';
    (*(code *)*_GRULayerParams_default_instance_)();
  }
  if (DAT_00747e10 == '\x01') {
    DAT_00747e10 = '\0';
    (*(code *)*_LSTMParams_default_instance_)();
  }
  if (DAT_00747ea8 == '\x01') {
    DAT_00747ea8 = '\0';
    (*(code *)*_LSTMWeightParams_default_instance_)();
  }
  if (DAT_00747f00 == '\x01') {
    DAT_00747f00 = '\0';
    (*(code *)*_UniDirectionalLSTMLayerParams_default_instance_)();
  }
  if (DAT_00747f80 == '\x01') {
    DAT_00747f80 = '\0';
    (*(code *)*_BiDirectionalLSTMLayerParams_default_instance_)();
  }
  if (DAT_00747fa8 == '\x01') {
    DAT_00747fa8 = '\0';
    (*(code *)*_CustomLayerParams_CustomLayerParamValue_default_instance_)();
  }
  if (DAT_00748070 == '\x01') {
    DAT_00748070 = '\0';
    (*(code *)*_CustomLayerParams_default_instance_)();
  }
  if (DAT_007480a0 == '\x01') {
    DAT_007480a0 = '\0';
    (*(code *)*_TransposeLayerParams_default_instance_)();
  }
  if (DAT_007480e0 == '\x01') {
    DAT_007480e0 = '\0';
    (*(code *)*_BatchedMatMulLayerParams_default_instance_)();
  }
  if (DAT_00748108 == '\x01') {
    DAT_00748108 = '\0';
    (*(code *)*_ConcatNDLayerParams_default_instance_)();
  }
  if (DAT_00748130 == '\x01') {
    DAT_00748130 = '\0';
    (*(code *)*_SoftmaxNDLayerParams_default_instance_)();
  }
  if (DAT_00748160 == '\x01') {
    DAT_00748160 = '\0';
    (*(code *)*_ReverseLayerParams_default_instance_)();
  }
  if (DAT_00748190 == '\x01') {
    DAT_00748190 = '\0';
    (*(code *)*_ReverseSeqLayerParams_default_instance_)();
  }
  if (DAT_007481d0 == '\x01') {
    DAT_007481d0 = '\0';
    (*(code *)*_LoadConstantNDLayerParams_default_instance_)();
  }
  if (DAT_007481f0 == '\x01') {
    DAT_007481f0 = '\0';
    (*(code *)*_FillLikeLayerParams_default_instance_)();
  }
  if (DAT_00748228 == '\x01') {
    DAT_00748228 = '\0';
    (*(code *)*_FillStaticLayerParams_default_instance_)();
  }
  if (DAT_00748248 == '\x01') {
    DAT_00748248 = '\0';
    (*(code *)*_FillDynamicLayerParams_default_instance_)();
  }
  if (DAT_00748268 == '\x01') {
    DAT_00748268 = '\0';
    (*(code *)*_WhereBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00748288 == '\x01') {
    DAT_00748288 = '\0';
    (*(code *)*_SinLayerParams_default_instance_)();
  }
  if (DAT_007482a8 == '\x01') {
    DAT_007482a8 = '\0';
    (*(code *)*_CosLayerParams_default_instance_)();
  }
  if (DAT_007482c8 == '\x01') {
    DAT_007482c8 = '\0';
    (*(code *)*_TanLayerParams_default_instance_)();
  }
  if (DAT_007482e8 == '\x01') {
    DAT_007482e8 = '\0';
    (*(code *)*_AsinLayerParams_default_instance_)();
  }
  if (DAT_00748308 == '\x01') {
    DAT_00748308 = '\0';
    (*(code *)*_AcosLayerParams_default_instance_)();
  }
  if (DAT_00748328 == '\x01') {
    DAT_00748328 = '\0';
    (*(code *)*_AtanLayerParams_default_instance_)();
  }
  if (DAT_00748348 == '\x01') {
    DAT_00748348 = '\0';
    (*(code *)*_SinhLayerParams_default_instance_)();
  }
  if (DAT_00748368 == '\x01') {
    DAT_00748368 = '\0';
    (*(code *)*_CoshLayerParams_default_instance_)();
  }
  if (DAT_00748388 == '\x01') {
    DAT_00748388 = '\0';
    (*(code *)*_TanhLayerParams_default_instance_)();
  }
  if (DAT_007483a8 == '\x01') {
    DAT_007483a8 = '\0';
    (*(code *)*_AsinhLayerParams_default_instance_)();
  }
  if (DAT_007483c8 == '\x01') {
    DAT_007483c8 = '\0';
    (*(code *)*_AcoshLayerParams_default_instance_)();
  }
  if (DAT_007483e8 == '\x01') {
    DAT_007483e8 = '\0';
    (*(code *)*_AtanhLayerParams_default_instance_)();
  }
  if (DAT_00748408 == '\x01') {
    DAT_00748408 = '\0';
    (*(code *)*_PowBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00748428 == '\x01') {
    DAT_00748428 = '\0';
    (*(code *)*_Exp2LayerParams_default_instance_)();
  }
  if (DAT_00748448 == '\x01') {
    DAT_00748448 = '\0';
    (*(code *)*_WhereNonZeroLayerParams_default_instance_)();
  }
  if (DAT_00748478 == '\x01') {
    DAT_00748478 = '\0';
    (*(code *)*_MatrixBandPartLayerParams_default_instance_)();
  }
  if (DAT_007484a0 == '\x01') {
    DAT_007484a0 = '\0';
    (*(code *)*_UpperTriangularLayerParams_default_instance_)();
  }
  if (DAT_007484c8 == '\x01') {
    DAT_007484c8 = '\0';
    (*(code *)*_LowerTriangularLayerParams_default_instance_)();
  }
  if (DAT_007484e8 == '\x01') {
    DAT_007484e8 = '\0';
    (*(code *)*_BroadcastToLikeLayerParams_default_instance_)();
  }
  if (DAT_00748518 == '\x01') {
    DAT_00748518 = '\0';
    (*(code *)*_BroadcastToStaticLayerParams_default_instance_)();
  }
  if (DAT_00748538 == '\x01') {
    DAT_00748538 = '\0';
    (*(code *)*_BroadcastToDynamicLayerParams_default_instance_)();
  }
  if (DAT_00748558 == '\x01') {
    DAT_00748558 = '\0';
    (*(code *)*_AddBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00748578 == '\x01') {
    DAT_00748578 = '\0';
    (*(code *)*_MaxBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00748598 == '\x01') {
    DAT_00748598 = '\0';
    (*(code *)*_MinBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_007485b8 == '\x01') {
    DAT_007485b8 = '\0';
    (*(code *)*_ModBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_007485d8 == '\x01') {
    DAT_007485d8 = '\0';
    (*(code *)*_FloorDivBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_007485f8 == '\x01') {
    DAT_007485f8 = '\0';
    (*(code *)*_SubtractBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00748618 == '\x01') {
    DAT_00748618 = '\0';
    (*(code *)*_MultiplyBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00748638 == '\x01') {
    DAT_00748638 = '\0';
    (*(code *)*_DivideBroadcastableLayerParams_default_instance_)();
  }
  if (DAT_00748660 == '\x01') {
    DAT_00748660 = '\0';
    (*(code *)*_GatherLayerParams_default_instance_)();
  }
  if (DAT_00748688 == '\x01') {
    DAT_00748688 = '\0';
    (*(code *)*_ScatterLayerParams_default_instance_)();
  }
  if (DAT_007486a8 == '\x01') {
    DAT_007486a8 = '\0';
    (*(code *)*_GatherNDLayerParams_default_instance_)();
  }
  if (DAT_007486c8 == '\x01') {
    DAT_007486c8 = '\0';
    (*(code *)*_ScatterNDLayerParams_default_instance_)();
  }
  if (DAT_007486f0 == '\x01') {
    DAT_007486f0 = '\0';
    (*(code *)*_GatherAlongAxisLayerParams_default_instance_)();
  }
  if (DAT_00748718 == '\x01') {
    DAT_00748718 = '\0';
    (*(code *)*_ScatterAlongAxisLayerParams_default_instance_)();
  }
  if (DAT_00748740 == '\x01') {
    DAT_00748740 = '\0';
    (*(code *)*_StackLayerParams_default_instance_)();
  }
  if (DAT_00748770 == '\x01') {
    DAT_00748770 = '\0';
    (*(code *)*_RankPreservingReshapeLayerParams_default_instance_)();
  }
  if (DAT_007487a8 == '\x01') {
    DAT_007487a8 = '\0';
    (*(code *)*_ConstantPaddingLayerParams_default_instance_)();
  }
  if (DAT_007487d8 == '\x01') {
    DAT_007487d8 = '\0';
    (*(code *)*_RandomNormalLikeLayerParams_default_instance_)();
  }
  if (DAT_00748820 == '\x01') {
    DAT_00748820 = '\0';
    (*(code *)*_RandomNormalStaticLayerParams_default_instance_)();
  }
  if (DAT_00748850 == '\x01') {
    DAT_00748850 = '\0';
    (*(code *)*_RandomNormalDynamicLayerParams_default_instance_)();
  }
  if (DAT_00748880 == '\x01') {
    DAT_00748880 = '\0';
    (*(code *)*_RandomUniformLikeLayerParams_default_instance_)();
  }
  if (DAT_007488c8 == '\x01') {
    DAT_007488c8 = '\0';
    (*(code *)*_RandomUniformStaticLayerParams_default_instance_)();
  }
  if (DAT_007488f8 == '\x01') {
    DAT_007488f8 = '\0';
    (*(code *)*_RandomUniformDynamicLayerParams_default_instance_)();
  }
  if (DAT_00748920 == '\x01') {
    DAT_00748920 = '\0';
    (*(code *)*_RandomBernoulliLikeLayerParams_default_instance_)();
  }
  if (DAT_00748960 == '\x01') {
    DAT_00748960 = '\0';
    (*(code *)*_RandomBernoulliStaticLayerParams_default_instance_)();
  }
  if (DAT_00748988 == '\x01') {
    DAT_00748988 = '\0';
    (*(code *)*_RandomBernoulliDynamicLayerParams_default_instance_)();
  }
  if (DAT_007489c0 == '\x01') {
    DAT_007489c0 = '\0';
    (*(code *)*_CategoricalDistributionLayerParams_default_instance_)();
  }
  if (DAT_007489f8 == '\x01') {
    DAT_007489f8 = '\0';
    (*(code *)*_ReduceL1LayerParams_default_instance_)();
  }
  if (DAT_00748a30 == '\x01') {
    DAT_00748a30 = '\0';
    (*(code *)*_ReduceL2LayerParams_default_instance_)();
  }
  if (DAT_00748a68 == '\x01') {
    DAT_00748a68 = '\0';
    (*(code *)*_ReduceMaxLayerParams_default_instance_)();
  }
  if (DAT_00748aa0 == '\x01') {
    DAT_00748aa0 = '\0';
    (*(code *)*_ReduceMinLayerParams_default_instance_)();
  }
  if (DAT_00748ad8 == '\x01') {
    DAT_00748ad8 = '\0';
    (*(code *)*_ReduceSumLayerParams_default_instance_)();
  }
  if (DAT_00748b10 == '\x01') {
    DAT_00748b10 = '\0';
    (*(code *)*_ReduceProdLayerParams_default_instance_)();
  }
  if (DAT_00748b48 == '\x01') {
    DAT_00748b48 = '\0';
    (*(code *)*_ReduceMeanLayerParams_default_instance_)();
  }
  if (DAT_00748b80 == '\x01') {
    DAT_00748b80 = '\0';
    (*(code *)*_ReduceLogSumLayerParams_default_instance_)();
  }
  if (DAT_00748bb8 == '\x01') {
    DAT_00748bb8 = '\0';
    (*(code *)*_ReduceSumSquareLayerParams_default_instance_)();
  }
  if (DAT_00748bf0 == '\x01') {
    DAT_00748bf0 = '\0';
    (*(code *)*_ReduceLogSumExpLayerParams_default_instance_)();
  }
  if (DAT_00748c20 == '\x01') {
    DAT_00748c20 = '\0';
    (*(code *)*_ExpandDimsLayerParams_default_instance_)();
  }
  if (DAT_00748c48 == '\x01') {
    DAT_00748c48 = '\0';
    (*(code *)*_FlattenTo2DLayerParams_default_instance_)();
  }
  if (DAT_00748c78 == '\x01') {
    DAT_00748c78 = '\0';
    (*(code *)*_ReshapeStaticLayerParams_default_instance_)();
  }
  if (DAT_00748c98 == '\x01') {
    DAT_00748c98 = '\0';
    (*(code *)*_ReshapeLikeLayerParams_default_instance_)();
  }
  if (DAT_00748cb8 == '\x01') {
    DAT_00748cb8 = '\0';
    (*(code *)*_ReshapeDynamicLayerParams_default_instance_)();
  }
  if (DAT_00748cf0 == '\x01') {
    DAT_00748cf0 = '\0';
    (*(code *)*_SqueezeLayerParams_default_instance_)();
  }
  if (DAT_00748d20 == '\x01') {
    DAT_00748d20 = '\0';
    (*(code *)*_TopKLayerParams_default_instance_)();
  }
  if (DAT_00748d48 == '\x01') {
    DAT_00748d48 = '\0';
    (*(code *)*_ArgMaxLayerParams_default_instance_)();
  }
  if (DAT_00748d70 == '\x01') {
    DAT_00748d70 = '\0';
    (*(code *)*_ArgMinLayerParams_default_instance_)();
  }
  if (DAT_00748db8 == '\x01') {
    DAT_00748db8 = '\0';
    (*(code *)*_SplitNDLayerParams_default_instance_)();
  }
  if (DAT_00748dd8 == '\x01') {
    DAT_00748dd8 = '\0';
    (*(code *)*_CeilLayerParams_default_instance_)();
  }
  if (DAT_00748df8 == '\x01') {
    DAT_00748df8 = '\0';
    (*(code *)*_RoundLayerParams_default_instance_)();
  }
  if (DAT_00748e18 == '\x01') {
    DAT_00748e18 = '\0';
    (*(code *)*_FloorLayerParams_default_instance_)();
  }
  if (DAT_00748e38 == '\x01') {
    DAT_00748e38 = '\0';
    (*(code *)*_SignLayerParams_default_instance_)();
  }
  if (DAT_00748e60 == '\x01') {
    DAT_00748e60 = '\0';
    (*(code *)*_ClipLayerParams_default_instance_)();
  }
  if (DAT_00748f08 == '\x01') {
    DAT_00748f08 = '\0';
    (*(code *)*_SliceStaticLayerParams_default_instance_)();
  }
  if (DAT_00748f98 == '\x01') {
    DAT_00748f98 = '\0';
    (*(code *)*_SliceDynamicLayerParams_default_instance_)();
  }
  if (DAT_00748fc8 == '\x01') {
    DAT_00748fc8 = '\0';
    (*(code *)*_TileLayerParams_default_instance_)();
  }
  if (DAT_00748fe8 == '\x01') {
    DAT_00748fe8 = '\0';
    (*(code *)*_GetShapeLayerParams_default_instance_)();
  }
  if (DAT_00749008 == '\x01') {
    DAT_00749008 = '\0';
    (*(code *)*_ErfLayerParams_default_instance_)();
  }
  if (DAT_00749028 == '\x01') {
    DAT_00749028 = '\0';
    (*(code *)*_GeluLayerParams_default_instance_)();
  }
  if (DAT_00749050 == '\x01') {
    DAT_00749050 = '\0';
    (*(code *)*_RangeStaticLayerParams_default_instance_)();
  }
  if (DAT_00749078 == '\x01') {
    DAT_00749078 = '\0';
    (*(code *)*_RangeDynamicLayerParams_default_instance_)();
  }
  if (DAT_007490b0 == '\x01') {
    DAT_007490b0 = '\0';
    (*(code *)*_SlidingWindowsLayerParams_default_instance_)();
  }
  if (DAT_007490f8 == '\x01') {
    DAT_007490f8 = '\0';
    (*(code *)*_LayerNormalizationLayerParams_default_instance_)();
  }
  if (DAT_00749128 == '\x01') {
    DAT_00749128 = '\0';
    (*(code *)*_NonMaximumSuppressionLayerParams_default_instance_)();
  }
  if (DAT_00749150 == '\x01') {
    DAT_00749150 = '\0';
    (*(code *)*_ClampedReLULayerParams_default_instance_)();
  }
  if (DAT_00749178 == '\x01') {
    DAT_00749178 = '\0';
    (*(code *)*_ArgSortLayerParams_default_instance_)();
  }
  if (DAT_007491a8 == '\x01') {
    DAT_007491a8 = '\0';
    (*(code *)*_SliceBySizeLayerParams_default_instance_)();
  }
  if (DAT_00749218 == '\x01') {
    DAT_00749218 = '\0';
    (*(code *)*_NeuralNetworkClassifier_default_instance_)();
  }
  if (DAT_00749260 == '\x01') {
    DAT_00749260 = '\0';
    (*(code *)*_OneHotLayerParams_default_instance_)();
  }
  if (DAT_00749288 == '\x01') {
    DAT_00749288 = '\0';
    (*(code *)*_CumSumLayerParams_default_instance_)();
  }
  if (DAT_007492e8 == '\x01') {
    DAT_007492e8 = '\0';
    (*(code *)*_NeuralNetworkRegressor_default_instance_)();
  }
  if (DAT_00749340 == '\x01') {
    DAT_00749340 = '\0';
    (*(code *)*_NetworkUpdateParameters_default_instance_)();
  }
  if (DAT_00749370 == '\x01') {
    DAT_00749370 = '\0';
    (*(code *)*_LossLayer_default_instance_)();
  }
  if (DAT_007493b0 == '\x01') {
    DAT_007493b0 = '\0';
    (*(code *)*_CategoricalCrossEntropyLossLayer_default_instance_)();
  }
  if (DAT_007493e0 == '\x01') {
    DAT_007493e0 = '\0';
    (*(code *)*_MeanSquaredErrorLossLayer_default_instance_)();
  }
  if (DAT_00749408 == '\x01') {
    DAT_00749408 = '\0';
    (*(code *)*_Optimizer_default_instance_)();
  }
  if (DAT_00749450 == '\x01') {
    DAT_00749450 = '\0';
    (*(code *)*_SGDOptimizer_default_instance_)();
  }
  if (DAT_00749498 == '\x01') {
    DAT_00749498 = 0;
    (*(code *)*_AdamOptimizer_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NeuralNetwork_default_instance_.Shutdown();
  _NeuralNetworkImageScaler_default_instance_.Shutdown();
  _NeuralNetworkMeanImage_default_instance_.Shutdown();
  _NeuralNetworkPreprocessing_default_instance_.Shutdown();
  _ActivationReLU_default_instance_.Shutdown();
  _ActivationLeakyReLU_default_instance_.Shutdown();
  _ActivationTanh_default_instance_.Shutdown();
  _ActivationScaledTanh_default_instance_.Shutdown();
  _ActivationSigmoid_default_instance_.Shutdown();
  _ActivationLinear_default_instance_.Shutdown();
  _ActivationSigmoidHard_default_instance_.Shutdown();
  _ActivationPReLU_default_instance_.Shutdown();
  _ActivationELU_default_instance_.Shutdown();
  _ActivationThresholdedReLU_default_instance_.Shutdown();
  _ActivationSoftsign_default_instance_.Shutdown();
  _ActivationSoftplus_default_instance_.Shutdown();
  _ActivationParametricSoftplus_default_instance_.Shutdown();
  _ActivationParams_default_instance_.Shutdown();
  _Tensor_default_instance_.Shutdown();
  _NeuralNetworkLayer_default_instance_.Shutdown();
  _BranchLayerParams_default_instance_.Shutdown();
  _LoopLayerParams_default_instance_.Shutdown();
  _LoopBreakLayerParams_default_instance_.Shutdown();
  _LoopContinueLayerParams_default_instance_.Shutdown();
  _CopyLayerParams_default_instance_.Shutdown();
  _GreaterThanLayerParams_default_instance_.Shutdown();
  _GreaterEqualLayerParams_default_instance_.Shutdown();
  _LessThanLayerParams_default_instance_.Shutdown();
  _LessEqualLayerParams_default_instance_.Shutdown();
  _EqualLayerParams_default_instance_.Shutdown();
  _NotEqualLayerParams_default_instance_.Shutdown();
  _LogicalAndLayerParams_default_instance_.Shutdown();
  _LogicalOrLayerParams_default_instance_.Shutdown();
  _LogicalXorLayerParams_default_instance_.Shutdown();
  _LogicalNotLayerParams_default_instance_.Shutdown();
  _BorderAmounts_EdgeSizes_default_instance_.Shutdown();
  _BorderAmounts_default_instance_.Shutdown();
  _ValidPadding_default_instance_.Shutdown();
  _SamePadding_default_instance_.Shutdown();
  _SamplingMode_default_instance_.Shutdown();
  _BoxCoordinatesMode_default_instance_.Shutdown();
  _WeightParams_default_instance_.Shutdown();
  _QuantizationParams_default_instance_.Shutdown();
  _LinearQuantizationParams_default_instance_.Shutdown();
  _LookUpTableQuantizationParams_default_instance_.Shutdown();
  _ConvolutionLayerParams_default_instance_.Shutdown();
  _Convolution3DLayerParams_default_instance_.Shutdown();
  _InnerProductLayerParams_default_instance_.Shutdown();
  _EmbeddingLayerParams_default_instance_.Shutdown();
  _EmbeddingNDLayerParams_default_instance_.Shutdown();
  _BatchnormLayerParams_default_instance_.Shutdown();
  _PoolingLayerParams_ValidCompletePadding_default_instance_.Shutdown();
  _PoolingLayerParams_default_instance_.Shutdown();
  _Pooling3DLayerParams_default_instance_.Shutdown();
  _GlobalPooling3DLayerParams_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingConstant_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReflection_default_instance_.Shutdown();
  _PaddingLayerParams_PaddingReplication_default_instance_.Shutdown();
  _PaddingLayerParams_default_instance_.Shutdown();
  _ConcatLayerParams_default_instance_.Shutdown();
  _LRNLayerParams_default_instance_.Shutdown();
  _SoftmaxLayerParams_default_instance_.Shutdown();
  _SplitLayerParams_default_instance_.Shutdown();
  _AddLayerParams_default_instance_.Shutdown();
  _MultiplyLayerParams_default_instance_.Shutdown();
  _UnaryFunctionLayerParams_default_instance_.Shutdown();
  _UpsampleLayerParams_default_instance_.Shutdown();
  _ResizeBilinearLayerParams_default_instance_.Shutdown();
  _CropResizeLayerParams_default_instance_.Shutdown();
  _BiasLayerParams_default_instance_.Shutdown();
  _ScaleLayerParams_default_instance_.Shutdown();
  _LoadConstantLayerParams_default_instance_.Shutdown();
  _L2NormalizeLayerParams_default_instance_.Shutdown();
  _FlattenLayerParams_default_instance_.Shutdown();
  _ReshapeLayerParams_default_instance_.Shutdown();
  _PermuteLayerParams_default_instance_.Shutdown();
  _ReorganizeDataLayerParams_default_instance_.Shutdown();
  _SliceLayerParams_default_instance_.Shutdown();
  _ReduceLayerParams_default_instance_.Shutdown();
  _CropLayerParams_default_instance_.Shutdown();
  _AverageLayerParams_default_instance_.Shutdown();
  _MaxLayerParams_default_instance_.Shutdown();
  _MinLayerParams_default_instance_.Shutdown();
  _DotProductLayerParams_default_instance_.Shutdown();
  _MeanVarianceNormalizeLayerParams_default_instance_.Shutdown();
  _SequenceRepeatLayerParams_default_instance_.Shutdown();
  _SimpleRecurrentLayerParams_default_instance_.Shutdown();
  _GRULayerParams_default_instance_.Shutdown();
  _LSTMParams_default_instance_.Shutdown();
  _LSTMWeightParams_default_instance_.Shutdown();
  _UniDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _BiDirectionalLSTMLayerParams_default_instance_.Shutdown();
  _CustomLayerParams_CustomLayerParamValue_default_instance_.Shutdown();
  _CustomLayerParams_default_instance_.Shutdown();
  _TransposeLayerParams_default_instance_.Shutdown();
  _BatchedMatMulLayerParams_default_instance_.Shutdown();
  _ConcatNDLayerParams_default_instance_.Shutdown();
  _SoftmaxNDLayerParams_default_instance_.Shutdown();
  _ReverseLayerParams_default_instance_.Shutdown();
  _ReverseSeqLayerParams_default_instance_.Shutdown();
  _LoadConstantNDLayerParams_default_instance_.Shutdown();
  _FillLikeLayerParams_default_instance_.Shutdown();
  _FillStaticLayerParams_default_instance_.Shutdown();
  _FillDynamicLayerParams_default_instance_.Shutdown();
  _WhereBroadcastableLayerParams_default_instance_.Shutdown();
  _SinLayerParams_default_instance_.Shutdown();
  _CosLayerParams_default_instance_.Shutdown();
  _TanLayerParams_default_instance_.Shutdown();
  _AsinLayerParams_default_instance_.Shutdown();
  _AcosLayerParams_default_instance_.Shutdown();
  _AtanLayerParams_default_instance_.Shutdown();
  _SinhLayerParams_default_instance_.Shutdown();
  _CoshLayerParams_default_instance_.Shutdown();
  _TanhLayerParams_default_instance_.Shutdown();
  _AsinhLayerParams_default_instance_.Shutdown();
  _AcoshLayerParams_default_instance_.Shutdown();
  _AtanhLayerParams_default_instance_.Shutdown();
  _PowBroadcastableLayerParams_default_instance_.Shutdown();
  _Exp2LayerParams_default_instance_.Shutdown();
  _WhereNonZeroLayerParams_default_instance_.Shutdown();
  _MatrixBandPartLayerParams_default_instance_.Shutdown();
  _UpperTriangularLayerParams_default_instance_.Shutdown();
  _LowerTriangularLayerParams_default_instance_.Shutdown();
  _BroadcastToLikeLayerParams_default_instance_.Shutdown();
  _BroadcastToStaticLayerParams_default_instance_.Shutdown();
  _BroadcastToDynamicLayerParams_default_instance_.Shutdown();
  _AddBroadcastableLayerParams_default_instance_.Shutdown();
  _MaxBroadcastableLayerParams_default_instance_.Shutdown();
  _MinBroadcastableLayerParams_default_instance_.Shutdown();
  _ModBroadcastableLayerParams_default_instance_.Shutdown();
  _FloorDivBroadcastableLayerParams_default_instance_.Shutdown();
  _SubtractBroadcastableLayerParams_default_instance_.Shutdown();
  _MultiplyBroadcastableLayerParams_default_instance_.Shutdown();
  _DivideBroadcastableLayerParams_default_instance_.Shutdown();
  _GatherLayerParams_default_instance_.Shutdown();
  _ScatterLayerParams_default_instance_.Shutdown();
  _GatherNDLayerParams_default_instance_.Shutdown();
  _ScatterNDLayerParams_default_instance_.Shutdown();
  _GatherAlongAxisLayerParams_default_instance_.Shutdown();
  _ScatterAlongAxisLayerParams_default_instance_.Shutdown();
  _StackLayerParams_default_instance_.Shutdown();
  _RankPreservingReshapeLayerParams_default_instance_.Shutdown();
  _ConstantPaddingLayerParams_default_instance_.Shutdown();
  _RandomNormalLikeLayerParams_default_instance_.Shutdown();
  _RandomNormalStaticLayerParams_default_instance_.Shutdown();
  _RandomNormalDynamicLayerParams_default_instance_.Shutdown();
  _RandomUniformLikeLayerParams_default_instance_.Shutdown();
  _RandomUniformStaticLayerParams_default_instance_.Shutdown();
  _RandomUniformDynamicLayerParams_default_instance_.Shutdown();
  _RandomBernoulliLikeLayerParams_default_instance_.Shutdown();
  _RandomBernoulliStaticLayerParams_default_instance_.Shutdown();
  _RandomBernoulliDynamicLayerParams_default_instance_.Shutdown();
  _CategoricalDistributionLayerParams_default_instance_.Shutdown();
  _ReduceL1LayerParams_default_instance_.Shutdown();
  _ReduceL2LayerParams_default_instance_.Shutdown();
  _ReduceMaxLayerParams_default_instance_.Shutdown();
  _ReduceMinLayerParams_default_instance_.Shutdown();
  _ReduceSumLayerParams_default_instance_.Shutdown();
  _ReduceProdLayerParams_default_instance_.Shutdown();
  _ReduceMeanLayerParams_default_instance_.Shutdown();
  _ReduceLogSumLayerParams_default_instance_.Shutdown();
  _ReduceSumSquareLayerParams_default_instance_.Shutdown();
  _ReduceLogSumExpLayerParams_default_instance_.Shutdown();
  _ExpandDimsLayerParams_default_instance_.Shutdown();
  _FlattenTo2DLayerParams_default_instance_.Shutdown();
  _ReshapeStaticLayerParams_default_instance_.Shutdown();
  _ReshapeLikeLayerParams_default_instance_.Shutdown();
  _ReshapeDynamicLayerParams_default_instance_.Shutdown();
  _SqueezeLayerParams_default_instance_.Shutdown();
  _TopKLayerParams_default_instance_.Shutdown();
  _ArgMaxLayerParams_default_instance_.Shutdown();
  _ArgMinLayerParams_default_instance_.Shutdown();
  _SplitNDLayerParams_default_instance_.Shutdown();
  _CeilLayerParams_default_instance_.Shutdown();
  _RoundLayerParams_default_instance_.Shutdown();
  _FloorLayerParams_default_instance_.Shutdown();
  _SignLayerParams_default_instance_.Shutdown();
  _ClipLayerParams_default_instance_.Shutdown();
  _SliceStaticLayerParams_default_instance_.Shutdown();
  _SliceDynamicLayerParams_default_instance_.Shutdown();
  _TileLayerParams_default_instance_.Shutdown();
  _GetShapeLayerParams_default_instance_.Shutdown();
  _ErfLayerParams_default_instance_.Shutdown();
  _GeluLayerParams_default_instance_.Shutdown();
  _RangeStaticLayerParams_default_instance_.Shutdown();
  _RangeDynamicLayerParams_default_instance_.Shutdown();
  _SlidingWindowsLayerParams_default_instance_.Shutdown();
  _LayerNormalizationLayerParams_default_instance_.Shutdown();
  _NonMaximumSuppressionLayerParams_default_instance_.Shutdown();
  _ClampedReLULayerParams_default_instance_.Shutdown();
  _ArgSortLayerParams_default_instance_.Shutdown();
  _SliceBySizeLayerParams_default_instance_.Shutdown();
  _NeuralNetworkClassifier_default_instance_.Shutdown();
  _OneHotLayerParams_default_instance_.Shutdown();
  _CumSumLayerParams_default_instance_.Shutdown();
  _NeuralNetworkRegressor_default_instance_.Shutdown();
  _NetworkUpdateParameters_default_instance_.Shutdown();
  _LossLayer_default_instance_.Shutdown();
  _CategoricalCrossEntropyLossLayer_default_instance_.Shutdown();
  _MeanSquaredErrorLossLayer_default_instance_.Shutdown();
  _Optimizer_default_instance_.Shutdown();
  _SGDOptimizer_default_instance_.Shutdown();
  _AdamOptimizer_default_instance_.Shutdown();
}